

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O2

uint __thiscall
crnlib::command_line_params::find
          (command_line_params *this,uint num_keys,char **ppKeys,
          vector<std::_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
          *pIterators,vector<unsigned_int> *pUnmatched_indices)

{
  param_map_const_iterator pVar1;
  uint index;
  uint uVar2;
  uint i;
  ulong uVar3;
  param_map_const_iterator begin;
  param_map_const_iterator end;
  _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
  local_58;
  command_line_params *local_50;
  param_map_const_iterator local_48;
  char **local_40;
  ulong local_38;
  
  local_50 = this;
  local_40 = ppKeys;
  if (pUnmatched_indices != (vector<unsigned_int> *)0x0) {
    vector<unsigned_int>::resize(pUnmatched_indices,(this->m_params).m_size,false);
    for (uVar3 = 0; uVar3 < (local_50->m_params).m_size; uVar3 = uVar3 + 1) {
      pUnmatched_indices->m_p[uVar3] = (uint)uVar3;
    }
  }
  uVar2 = 0;
  local_38 = (ulong)num_keys;
  for (uVar3 = 0; uVar3 != local_38; uVar3 = uVar3 + 1) {
    local_58._M_node = (_Rb_tree_node_base *)0x0;
    local_48._M_node = (_Rb_tree_node_base *)0x0;
    find(local_50,local_40[uVar3],&local_58,&local_48);
    pVar1._M_node = local_48._M_node;
    for (; local_58._M_node != pVar1._M_node;
        local_58._M_node = (_Base_ptr)std::_Rb_tree_increment(local_58._M_node)) {
      if (pIterators !=
          (vector<std::_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
           *)0x0) {
        vector<std::_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
        ::push_back(pIterators,&local_58);
      }
      if (pUnmatched_indices != (vector<unsigned_int> *)0x0) {
        index = vector<unsigned_int>::find(pUnmatched_indices,&local_58._M_node[2]._M_color);
        if (-1 < (int)index) {
          vector<unsigned_int>::erase_unordered(pUnmatched_indices,index);
        }
      }
      uVar2 = uVar2 + 1;
    }
  }
  return uVar2;
}

Assistant:

uint command_line_params::find(uint num_keys, const char** ppKeys, crnlib::vector<param_map_const_iterator>* pIterators, crnlib::vector<uint>* pUnmatched_indices) const {
  CRNLIB_ASSERT(ppKeys);

  if (pUnmatched_indices) {
    pUnmatched_indices->resize(m_params.size());
    for (uint i = 0; i < m_params.size(); i++)
      (*pUnmatched_indices)[i] = i;
  }

  uint n = 0;
  for (uint i = 0; i < num_keys; i++) {
    const char* pKey = ppKeys[i];

    param_map_const_iterator begin, end;
    find(pKey, begin, end);

    while (begin != end) {
      if (pIterators)
        pIterators->push_back(begin);

      if (pUnmatched_indices) {
        int k = pUnmatched_indices->find(begin->second.m_index);
        if (k >= 0)
          pUnmatched_indices->erase_unordered(k);
      }

      n++;
      begin++;
    }
  }

  return n;
}